

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

ODITHER_MATRIX_PTR make_odither_array(j_decompress_ptr cinfo,int ncolors)

{
  ODITHER_MATRIX_PTR paiVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int in_ESI;
  long in_RDI;
  JLONG den;
  JLONG num;
  int k;
  int j;
  ODITHER_MATRIX_PTR odither;
  int local_38;
  int local_20;
  int local_1c;
  
  paiVar1 = (ODITHER_MATRIX_PTR)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x400);
  lVar2 = (long)(in_ESI + -1) << 9;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
      lVar3 = (long)(int)((uint)base_dither_matrix[local_1c][local_20] * -2 + 0xff);
      lVar4 = lVar3 * 0xff;
      if (lVar4 < 0) {
        local_38 = -(int)((lVar3 * -0xff) / lVar2);
      }
      else {
        local_38 = (int)(lVar4 / lVar2);
      }
      paiVar1[local_1c][local_20] = local_38;
    }
  }
  return paiVar1;
}

Assistant:

LOCAL(ODITHER_MATRIX_PTR)
make_odither_array(j_decompress_ptr cinfo, int ncolors)
{
  ODITHER_MATRIX_PTR odither;
  int j, k;
  JLONG num, den;

  odither = (ODITHER_MATRIX_PTR)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(ODITHER_MATRIX));
  /* The inter-value distance for this color is MAXJSAMPLE/(ncolors-1).
   * Hence the dither value for the matrix cell with fill order f
   * (f=0..N-1) should be (N-1-2*f)/(2*N) * MAXJSAMPLE/(ncolors-1).
   * On 16-bit-int machine, be careful to avoid overflow.
   */
  den = 2 * ODITHER_CELLS * ((JLONG)(ncolors - 1));
  for (j = 0; j < ODITHER_SIZE; j++) {
    for (k = 0; k < ODITHER_SIZE; k++) {
      num = ((JLONG)(ODITHER_CELLS - 1 -
                     2 * ((int)base_dither_matrix[j][k]))) * MAXJSAMPLE;
      /* Ensure round towards zero despite C's lack of consistency
       * about rounding negative values in integer division...
       */
      odither[j][k] = (int)(num < 0 ? -((-num) / den) : num / den);
    }
  }
  return odither;
}